

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseSubstitution(State *state,bool accept_std)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  undefined **local_60;
  AbbrevPair *p;
  ParseState copy;
  ComplexityGuard local_28;
  ComplexityGuard guard;
  bool accept_std_local;
  State *state_local;
  
  guard.state_._7_1_ = accept_std;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_28,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_28);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    bVar4 = ParseTwoCharToken(state,"S_");
    if (bVar4) {
      MaybeAppend(state,"?");
      state_local._7_1_ = true;
    }
    else {
      uVar1 = (state->parse_state).mangled_idx;
      uVar2 = (state->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(state->parse_state).prev_name_idx;
      bVar4 = ParseOneCharToken(state,'S');
      if (((bVar4) && (bVar4 = ParseSeqId(state), bVar4)) &&
         (bVar4 = ParseOneCharToken(state,'_'), bVar4)) {
        MaybeAppend(state,"?");
        state_local._7_1_ = true;
      }
      else {
        (state->parse_state).mangled_idx = uVar1;
        (state->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseOneCharToken(state,'S');
        if (bVar4) {
          for (local_60 = &kSubstitutionList; *local_60 != (undefined *)0x0; local_60 = local_60 + 3
              ) {
            pcVar5 = RemainingInput(state);
            if ((*pcVar5 == (*local_60)[1]) &&
               (((guard.state_._7_1_ & 1) != 0 || ((*local_60)[1] != 't')))) {
              MaybeAppend(state,"std");
              if (*local_60[1] != '\0') {
                MaybeAppend(state,"::");
                MaybeAppend(state,local_60[1]);
              }
              (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 1;
              anon_unknown_3::UpdateHighWaterMark(state);
              state_local._7_1_ = true;
              goto LAB_0022e22a;
            }
          }
        }
        (state->parse_state).mangled_idx = uVar1;
        (state->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar3;
        state_local._7_1_ = false;
      }
    }
  }
LAB_0022e22a:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_28);
  return state_local._7_1_;
}

Assistant:

static bool ParseSubstitution(State *state, bool accept_std) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  state->parse_state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != nullptr; ++p) {
      if (RemainingInput(state)[0] == p->abbrev[1] &&
          (accept_std || p->abbrev[1] != 't')) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->parse_state.mangled_idx;
        UpdateHighWaterMark(state);
        return true;
      }
    }
  }
  state->parse_state = copy;
  return false;
}